

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

ScatterLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_scatter(NeuralNetworkLayer *this)

{
  bool bVar1;
  ScatterLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_scatter(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_scatter(this);
    this_00 = (ScatterLayerParams *)operator_new(0x20);
    ScatterLayerParams::ScatterLayerParams(this_00);
    (this->layer_).scatter_ = this_00;
  }
  return (ScatterLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::ScatterLayerParams* NeuralNetworkLayer::mutable_scatter() {
  if (!has_scatter()) {
    clear_layer();
    set_has_scatter();
    layer_.scatter_ = new ::CoreML::Specification::ScatterLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.scatter)
  return layer_.scatter_;
}